

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

void __thiscall
QItemSelectionModel::emitSelectionChanged
          (QItemSelectionModel *this,QItemSelection *newSelection,QItemSelection *oldSelection)

{
  compare_eq_result_container<QList<QItemSelectionRange>,_QItemSelectionRange> cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  qsizetype qVar5;
  ulong uVar6;
  QItemSelectionRange *lhs;
  long lVar7;
  QItemSelectionRange *rhs;
  int iVar8;
  QAbstractItemModel *pQVar9;
  long in_FS_OFFSET;
  ulong local_d0;
  QArrayDataPointer<QItemSelectionRange> local_b8;
  Data *local_98;
  QItemSelectionRange *pQStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QArrayDataPointer<QItemSelectionRange> local_78;
  QItemSelectionRange local_58;
  QArrayDataPointer<QItemSelectionRange> *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((oldSelection->super_QList<QItemSelectionRange>).d.size != 0) ||
      ((newSelection->super_QList<QItemSelectionRange>).d.size != 0)) &&
     (cVar1 = QList<QItemSelectionRange>::operator==
                        (&oldSelection->super_QList<QItemSelectionRange>,
                         &newSelection->super_QList<QItemSelectionRange>), !cVar1)) {
    uVar6 = (oldSelection->super_QList<QItemSelectionRange>).d.size;
    if ((uVar6 == 0) || ((newSelection->super_QList<QItemSelectionRange>).d.size == 0)) {
      local_58.tl.d = (QPersistentModelIndexData *)0x0;
      local_58.br.d = (QPersistentModelIndexData *)newSelection;
      local_48 = (QArrayDataPointer<QItemSelectionRange> *)oldSelection;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
    }
    else {
      local_78.d = (oldSelection->super_QList<QItemSelectionRange>).d.d;
      local_78.ptr = (oldSelection->super_QList<QItemSelectionRange>).d.ptr;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_98 = (newSelection->super_QList<QItemSelectionRange>).d.d;
      pQStack_90 = (newSelection->super_QList<QItemSelectionRange>).d.ptr;
      local_88.ptr = (QAbstractItemModel *)(newSelection->super_QList<QItemSelectionRange>).d.size;
      if (local_98 != (Data *)0x0) {
        LOCK();
        (local_98->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)
              (local_98->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      local_78.size = uVar6;
      if (uVar6 != 0) {
        lVar7 = 0;
        iVar4 = 0;
        do {
          if (local_88.ptr == (QAbstractItemModel *)0x0) {
            iVar3 = 1;
          }
          else {
            iVar3 = 1;
            qVar5 = 0;
            iVar8 = 0;
            do {
              if (local_78.size <= lVar7) break;
              lhs = local_78.ptr + lVar7;
              rhs = pQStack_90 + qVar5;
              bVar2 = ::comparesEqual(&lhs->tl,&rhs->tl);
              if ((bVar2) && (bVar2 = ::comparesEqual(&lhs->br,&rhs->br), bVar2)) {
                QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_78,lVar7);
                QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_98,qVar5);
                iVar3 = 0;
              }
              else {
                iVar8 = iVar8 + 1;
              }
              qVar5 = (qsizetype)iVar8;
            } while (qVar5 < (long)local_88.ptr);
          }
          iVar4 = iVar4 + iVar3 + 1;
          lVar7 = (long)iVar4;
        } while (lVar7 < local_78.size);
      }
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (QItemSelectionRange *)0x0;
      local_b8.size = 0;
      if (local_78.size != 0) {
        uVar6 = 0;
        do {
          if (local_88.ptr != (QAbstractItemModel *)0x0) {
            lVar7 = 0;
            pQVar9 = (QAbstractItemModel *)0x0;
            do {
              bVar2 = QItemSelectionRange::intersects
                                (local_78.ptr + uVar6,
                                 (QItemSelectionRange *)((long)&(pQStack_90->tl).d + lVar7));
              if (bVar2) {
                QItemSelectionRange::intersected(&local_58,local_78.ptr + uVar6);
                QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                          ((QMovableArrayOps<QItemSelectionRange> *)&local_b8,local_b8.size,
                           &local_58);
                QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_b8);
                QPersistentModelIndex::~QPersistentModelIndex(&local_58.br);
                QPersistentModelIndex::~QPersistentModelIndex(&local_58.tl);
              }
              pQVar9 = (QAbstractItemModel *)((long)&(pQVar9->super_QObject)._vptr_QObject + 1);
              lVar7 = lVar7 + 0x10;
            } while (pQVar9 < local_88.ptr);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)local_78.size);
      }
      if (local_b8.size != 0) {
        local_d0 = 0;
        do {
          if (local_78.size != 0) {
            qVar5 = 0;
            iVar4 = 0;
            do {
              bVar2 = QItemSelectionRange::intersects(local_78.ptr + qVar5,local_b8.ptr + local_d0);
              if (bVar2) {
                QItemSelection::split
                          (local_78.ptr + qVar5,local_b8.ptr + local_d0,(QItemSelection *)&local_78)
                ;
                QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_78,qVar5);
              }
              else {
                iVar4 = iVar4 + 1;
              }
              qVar5 = (qsizetype)iVar4;
            } while (qVar5 < local_78.size);
          }
          if (local_88.ptr != (QAbstractItemModel *)0x0) {
            qVar5 = 0;
            iVar4 = 0;
            do {
              bVar2 = QItemSelectionRange::intersects(pQStack_90 + qVar5,local_b8.ptr + local_d0);
              if (bVar2) {
                QItemSelection::split
                          (pQStack_90 + qVar5,local_b8.ptr + local_d0,(QItemSelection *)&local_98);
                QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_98,qVar5);
              }
              else {
                iVar4 = iVar4 + 1;
              }
              qVar5 = (qsizetype)iVar4;
            } while (qVar5 < (long)local_88.ptr);
          }
          local_d0 = local_d0 + 1;
        } while (local_d0 < (ulong)local_b8.size);
      }
      if ((local_88.ptr != (QAbstractItemModel *)0x0) || (local_78.size != 0)) {
        local_58.tl.d = (QPersistentModelIndexData *)0x0;
        local_58.br.d = (QPersistentModelIndexData *)&local_98;
        local_48 = &local_78;
        QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
      }
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                ((QArrayDataPointer<QItemSelectionRange> *)&local_98);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelectionModel::emitSelectionChanged(const QItemSelection &newSelection,
                                               const QItemSelection &oldSelection)
{
    // if both selections are empty or equal we return
    if ((oldSelection.isEmpty() && newSelection.isEmpty()) ||
        oldSelection == newSelection)
        return;

    // if either selection is empty we do not need to compare
    if (oldSelection.isEmpty() || newSelection.isEmpty()) {
        emit selectionChanged(newSelection, oldSelection);
        return;
    }

    QItemSelection deselected = oldSelection;
    QItemSelection selected = newSelection;

    // remove equal ranges
    bool advance;
    for (int o = 0; o < deselected.size(); ++o) {
        advance = true;
        for (int s = 0; s < selected.size() && o < deselected.size();) {
            if (deselected.at(o) == selected.at(s)) {
                deselected.removeAt(o);
                selected.removeAt(s);
                advance = false;
            } else {
                ++s;
            }
        }
        if (advance)
            ++o;
    }

    // find intersections
    QItemSelection intersections;
    for (int o = 0; o < deselected.size(); ++o) {
        for (int s = 0; s < selected.size(); ++s) {
            if (deselected.at(o).intersects(selected.at(s)))
                intersections.append(deselected.at(o).intersected(selected.at(s)));
        }
    }

    // compare remaining ranges with intersections and split them to find deselected and selected
    for (int i = 0; i < intersections.size(); ++i) {
        // split deselected
        for (int o = 0; o < deselected.size();) {
            if (deselected.at(o).intersects(intersections.at(i))) {
                QItemSelection::split(deselected.at(o), intersections.at(i), &deselected);
                deselected.removeAt(o);
            } else {
                ++o;
            }
        }
        // split selected
        for (int s = 0; s < selected.size();) {
            if (selected.at(s).intersects(intersections.at(i))) {
                QItemSelection::split(selected.at(s), intersections.at(i), &selected);
                selected.removeAt(s);
            } else {
                ++s;
            }
        }
    }

    if (!selected.isEmpty() || !deselected.isEmpty())
        emit selectionChanged(selected, deselected);
}